

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O2

void P_SpawnLinePortal(line_t_conflict *line)

{
  double *pdVar1;
  FLinePortal *pFVar2;
  FLinePortal *pFVar3;
  BYTE BVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  line_t_conflict *plVar9;
  byte bVar10;
  long lVar11;
  int i;
  long lVar12;
  
  if ((uint)line->args[2] < 4) {
    plVar9 = FindDestination(line,line->args[0]);
    uVar5 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
    line->portalindex = uVar5;
    pFVar3 = linePortals.Array;
    uVar6 = linePortals.Count - 1;
    pFVar2 = linePortals.Array + uVar6;
    pFVar2->mSinRot = 0.0;
    (&pFVar2->mSinRot)[1] = 0.0;
    pFVar3[uVar6].render_thinglist = (portnode_t *)0x0;
    pFVar2 = pFVar3 + uVar6;
    pFVar2->mType = '\0';
    pFVar2->mFlags = '\0';
    pFVar2->mDefFlags = '\0';
    pFVar2->mAlign = '\0';
    *(undefined4 *)&pFVar2->field_0x24 = 0;
    ((DAngle *)(&pFVar2->mType + 8))->Degrees = 0.0;
    pFVar3[uVar6].mDisplacement.X = 0.0;
    pFVar3[uVar6].mDisplacement.Y = 0.0;
    pFVar3[uVar6].mOrigin = (line_t *)line;
    pFVar3[uVar6].mDestination = (line_t *)plVar9;
    uVar5 = line->args[2];
    BVar4 = (BYTE)uVar5;
    pFVar3[uVar6].mType = BVar4;
    if ((uVar5 & 0xff) != 3) {
      uVar5 = 0;
      if ((uint)line->args[3] < 3) {
        uVar5 = line->args[3];
      }
      pFVar3[uVar6].mAlign = (BYTE)uVar5;
      if ((BYTE)uVar5 != '\0' && BVar4 == '\x02') {
        Printf("\x1cGWarning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n"
               ,((long)line - (long)lines) / 0x98 & 0xffffffff,((long)line - (long)lines) % 0x98);
        pFVar3[uVar6].mType = '\x01';
        plVar9 = (line_t_conflict *)pFVar3[uVar6].mDestination;
        BVar4 = '\x01';
      }
    }
    if (plVar9 != (line_t_conflict *)0x0) {
      bVar10 = (BVar4 != '\x01') << 3 | 7;
      if (BVar4 == '\0') {
        bVar10 = 1;
      }
      pFVar3[uVar6].mDefFlags = bVar10;
    }
  }
  else if ((line->args[2] == 4) && (line->args[0] == 0)) {
    iVar7 = FTagManager::GetFirstLineID(&tagManager,line);
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < numlines; lVar12 = lVar12 + 1) {
      iVar8 = FTagManager::GetFirstLineID
                        (&tagManager,(line_t_conflict *)((long)lines->args + lVar11 + -0x2c));
      if (((iVar8 == iVar7) && (*(int *)((long)lines->args + lVar11) == 1)) &&
         (*(int *)((long)lines->args + lVar11 + -4) == 0x9c)) {
        uVar5 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
        line->portalindex = uVar5;
        pFVar3 = linePortals.Array;
        uVar5 = linePortals.Count - 1;
        pFVar2 = linePortals.Array + uVar5;
        pFVar2->mCosRot = 0.0;
        (&pFVar2->mCosRot)[1] = 0.0;
        pFVar3[uVar5].mAngleDiff.Degrees = 0.0;
        (&pFVar3[uVar5].mAngleDiff)[1] = 0.0;
        pdVar1 = &pFVar3[uVar5].mDisplacement.Y;
        *pdVar1 = 0.0;
        pdVar1[1] = 0.0;
        pFVar3[uVar5].mDestination = (line_t *)0x0;
        ((DVector2 *)(&pFVar3[uVar5].mDestination + 1))->X = 0.0;
        pFVar3[uVar5].mOrigin = (line_t *)line;
        pFVar3[uVar5].mDestination = (line_t *)((long)lines->args + lVar11 + -0x2c);
        pFVar3[uVar5].mType = '\x03';
        pFVar3[uVar5].mDefFlags = '\x0f';
        uVar5 = TArray<FLinePortal,_FLinePortal>::Reserve(&linePortals,1);
        *(uint *)((long)lines->bbox + lVar11 + 0x38) = uVar5;
        pFVar3 = linePortals.Array;
        uVar5 = linePortals.Count - 1;
        pFVar2 = linePortals.Array + uVar5;
        pFVar2->mSinRot = 0.0;
        (&pFVar2->mSinRot)[1] = 0.0;
        pFVar2 = pFVar3 + uVar5;
        pFVar2->mType = '\0';
        pFVar2->mFlags = '\0';
        pFVar2->mDefFlags = '\0';
        pFVar2->mAlign = '\0';
        *(undefined4 *)&pFVar2->field_0x24 = 0;
        ((DAngle *)(&pFVar2->mType + 8))->Degrees = 0.0;
        pFVar3[uVar5].render_thinglist = (portnode_t *)0x0;
        pFVar3[uVar5].mDisplacement.X = 0.0;
        pFVar3[uVar5].mDisplacement.Y = 0.0;
        pFVar3[uVar5].mOrigin = (line_t *)0x0;
        pFVar3[uVar5].mDestination = (line_t *)0x0;
        pFVar3[uVar5].mOrigin = (line_t *)((long)lines->args + lVar11 + -0x2c);
        pFVar3[uVar5].mDestination = (line_t *)line;
        pFVar3[uVar5].mType = '\x03';
        pFVar3[uVar5].mDefFlags = '\x0f';
      }
      lVar11 = lVar11 + 0x98;
    }
  }
  return;
}

Assistant:

void P_SpawnLinePortal(line_t* line)
{
	// portal destination is special argument #0
	line_t* dst = NULL;

	if (line->args[2] >= PORTT_VISUAL && line->args[2] <= PORTT_LINKED)
	{
		dst = FindDestination(line, line->args[0]);

		line->portalindex = linePortals.Reserve(1);
		FLinePortal *port = &linePortals.Last();

		memset(port, 0, sizeof(FLinePortal));
		port->mOrigin = line;
		port->mDestination = dst;
		port->mType = BYTE(line->args[2]);	// range check is done above.

		if (port->mType == PORTT_LINKED)
		{
			// Linked portals have no z-offset ever.
			port->mAlign = PORG_ABSOLUTE;
		}
		else
		{
			port->mAlign = BYTE(line->args[3] >= PORG_ABSOLUTE && line->args[3] <= PORG_CEILING ? line->args[3] : PORG_ABSOLUTE);
			if (port->mType == PORTT_INTERACTIVE && port->mAlign != PORG_ABSOLUTE)
			{
				// Due to the way z is often handled, these pose a major issue for parts of the code that needs to transparently handle interactive portals.
				Printf(TEXTCOLOR_RED "Warning: z-offsetting not allowed for interactive portals. Changing line %d to teleport-portal!\n", int(line - lines));
				port->mType = PORTT_TELEPORT;
			}
		}
		if (port->mDestination != NULL)
		{
			port->mDefFlags = port->mType == PORTT_VISUAL ? PORTF_VISIBLE : port->mType == PORTT_TELEPORT ? PORTF_TYPETELEPORT : PORTF_TYPEINTERACTIVE;
		}
	}
	else if (line->args[2] == PORTT_LINKEDEE && line->args[0] == 0)
	{
		// EE-style portals require that the first line ID is identical and the first arg of the two linked linedefs are 0 and 1 respectively.

		int mytag = tagManager.GetFirstLineID(line);

		for (int i = 0; i < numlines; i++)
		{
			if (tagManager.GetFirstLineID(&lines[i]) == mytag && lines[i].args[0] == 1 && lines[i].special == Line_SetPortal)
			{
				line->portalindex = linePortals.Reserve(1);
				FLinePortal *port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = line;
				port->mDestination = &lines[i];
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;

				// we need to create the backlink here, too.
				lines[i].portalindex = linePortals.Reserve(1);
				port = &linePortals.Last();

				memset(port, 0, sizeof(FLinePortal));
				port->mOrigin = &lines[i];
				port->mDestination = line;
				port->mType = PORTT_LINKED;
				port->mAlign = PORG_ABSOLUTE;
				port->mDefFlags = PORTF_TYPEINTERACTIVE;
			}
		}
	}
	else
	{
		// undefined type
		return;
	}
}